

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O1

BOOL __thiscall
Memory::SmallHeapBlockT<SmallAllocationBlockAttributes>::IsInFreeObjectList
          (SmallHeapBlockT<SmallAllocationBlockAttributes> *this,void *objectAddress)

{
  FreeObject *this_00;
  
  this_00 = this->freeObjectList;
  while( true ) {
    if (this_00 == (FreeObject *)0x0) {
      return 0;
    }
    if (this_00 == (FreeObject *)objectAddress) break;
    this_00 = FreeObject::GetNext(this_00);
  }
  return 1;
}

Assistant:

BOOL
SmallHeapBlockT<TBlockAttributes>::IsInFreeObjectList(void * objectAddress)
{
    FreeObject * freeObject = this->freeObjectList;
    while (freeObject != nullptr)
    {
        if (freeObject == objectAddress)
        {
            return true;
        }
        freeObject = freeObject->GetNext();
    }
    return false;
}